

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus DecodeTestAndBranch(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  void *Decoder_00;
  undefined8 in_RCX;
  MCInst *in_RDX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint64_t dst;
  uint32_t bit;
  uint32_t Rt;
  uint RegNo;
  
  RegNo = (uint)((ulong)in_RCX >> 0x20);
  uVar1 = fieldFromInstruction(in_ESI,0,5);
  uVar2 = fieldFromInstruction(in_ESI,0x1f,1);
  uVar3 = uVar2 << 5;
  uVar2 = fieldFromInstruction(in_ESI,5,0xe);
  Decoder_00 = (void *)(ulong)uVar2;
  uVar2 = fieldFromInstruction(in_ESI,0x13,5);
  uVar3 = uVar2 | uVar3;
  if (((ulong)Decoder_00 & 0x2000) != 0) {
    Decoder_00 = (void *)((ulong)Decoder_00 | 0xffffffffffffc000);
  }
  uVar2 = fieldFromInstruction(in_ESI,0x1f,1);
  if (uVar2 == 0) {
    DecodeGPR32RegisterClass(in_RDX,RegNo,CONCAT44(uVar1,uVar3),Decoder_00);
  }
  else {
    DecodeGPR64RegisterClass(in_RDX,RegNo,CONCAT44(uVar1,uVar3),Decoder_00);
  }
  MCOperand_CreateImm0(in_RDI,(ulong)uVar3);
  MCOperand_CreateImm0(in_RDI,(int64_t)Decoder_00);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeTestAndBranch(MCInst *Inst, uint32_t insn,
		uint64_t Addr, const void *Decoder)
{
	uint32_t Rt = fieldFromInstruction(insn, 0, 5);
	uint32_t bit = fieldFromInstruction(insn, 31, 1) << 5;
	uint64_t dst = fieldFromInstruction(insn, 5, 14);

	bit |= fieldFromInstruction(insn, 19, 5);

	// Sign-extend 14-bit immediate.
	if (dst & (1 << (14 - 1)))
		dst |= ~((1LL << 14) - 1);

	if (fieldFromInstruction(insn, 31, 1) == 0)
		DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
	else
		DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);

	MCOperand_CreateImm0(Inst, bit);
	//if (!Dis->tryAddingSymbolicOperand(Inst, dst << 2, Addr, true, 0, 4))
	MCOperand_CreateImm0(Inst, dst);

	return Success;
}